

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

pair<const_slang::ast::ClassType_*,_bool> __thiscall
slang::ast::resolveNewClassTarget
          (ast *this,NameSyntax *nameSyntax,ASTContext *context,Type **assignmentTarget,
          SourceRange range)

{
  Type *pTVar1;
  ClassType *pCVar2;
  Type *pTVar3;
  Diagnostic *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  char *pcVar5;
  DiagCode code;
  size_t sVar6;
  ClassType *pCVar7;
  Token TVar8;
  pair<const_slang::ast::ClassType_*,_bool> pVar9;
  SourceRange SVar10;
  string_view arg;
  SourceRange sourceRange;
  undefined8 uVar4;
  
  if (*(int *)this == 0x67) {
    pTVar1 = (Type *)(context->scope).ptr;
    if (pTVar1 != (Type *)0x0) {
      pTVar3 = pTVar1->canonical;
      if (pTVar3 == (Type *)0x0) {
        Type::resolveCanonical(pTVar1);
        pTVar3 = pTVar1->canonical;
      }
      pTVar1 = (Type *)(context->scope).ptr;
      if ((pTVar3->super_Symbol).kind == ClassType) {
        pCVar2 = (ClassType *)pTVar1->canonical;
        if (pCVar2 == (ClassType *)0x0) {
          Type::resolveCanonical(pTVar1);
          pCVar2 = (ClassType *)pTVar1->canonical;
        }
LAB_0040358f:
        if (pCVar2->isAbstract == true) {
          code.subsystem = Expressions;
          code.code = 0x7d;
        }
        else {
          pCVar7 = pCVar2;
          if (pCVar2->isInterface != true) goto LAB_00403607;
          code.subsystem = Expressions;
          code.code = 0x7c;
        }
        sourceRange.endLoc = range.startLoc;
        sourceRange.startLoc = (SourceLocation)assignmentTarget;
        this_00 = ASTContext::addDiag((ASTContext *)nameSyntax,code,sourceRange);
        sVar6 = (pCVar2->super_Type).super_Symbol.name._M_len;
        pcVar5 = (pCVar2->super_Type).super_Symbol.name._M_str;
LAB_004035fc:
        arg._M_str = pcVar5;
        arg._M_len = sVar6;
        Diagnostic::operator<<(this_00,arg);
        goto LAB_00403604;
      }
      if (pTVar1 != (Type *)0x0) {
        pTVar3 = pTVar1->canonical;
        if (pTVar3 == (Type *)0x0) {
          Type::resolveCanonical(pTVar1);
          pTVar3 = pTVar1->canonical;
        }
        if ((pTVar3->super_Symbol).kind == ErrorType) goto LAB_00403604;
      }
    }
    SVar10.endLoc = range.startLoc;
    SVar10.startLoc = (SourceLocation)assignmentTarget;
    ASTContext::addDiag((ASTContext *)nameSyntax,(DiagCode)0x7b0007,SVar10);
LAB_00403604:
    pCVar7 = (ClassType *)0x0;
  }
  else {
    TVar8 = slang::syntax::SyntaxNode::getLastToken(*(SyntaxNode **)(this + 0x18));
    if (TVar8.kind == SuperKeyword) {
      pVar9 = Lookup::getContainingClass
                        (*(Scope **)&(nameSyntax->super_ExpressionSyntax).super_SyntaxNode);
      uVar4 = pVar9._8_8_;
      pCVar2 = pVar9.first;
      if ((pCVar2 != (ClassType *)0x0) && ((pCVar2->super_Type).super_Symbol.name._M_len != 0)) {
        if ((pCVar2->super_Scope).deferredMemberIndex != Invalid) {
          Scope::elaborate(&pCVar2->super_Scope);
          uVar4 = extraout_RDX;
        }
        pTVar1 = pCVar2->baseClass;
        if (pTVar1 == (Type *)0x0) {
          SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this);
          this_00 = ASTContext::addDiag((ASTContext *)nameSyntax,(DiagCode)0x2f000a,SVar10);
          sVar6 = (pCVar2->super_Type).super_Symbol.name._M_len;
          pcVar5 = (pCVar2->super_Type).super_Symbol.name._M_str;
          goto LAB_004035fc;
        }
        pCVar7 = (ClassType *)pTVar1->canonical;
        if (pCVar7 == (ClassType *)0x0) {
          Type::resolveCanonical(pTVar1);
          pCVar7 = (ClassType *)pTVar1->canonical;
          uVar4 = extraout_RDX_00;
        }
        if ((pCVar7->super_Type).super_Symbol.kind != ErrorType) {
          (context->scope).ptr =
               *(Scope **)
                (**(long **)&(nameSyntax->super_ExpressionSyntax).super_SyntaxNode + 0x188);
          uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
          goto LAB_00403609;
        }
      }
      goto LAB_00403604;
    }
    pCVar7 = (ClassType *)0x0;
    pCVar2 = Lookup::findClass(*(NameSyntax **)(this + 0x18),(ASTContext *)nameSyntax,
                               (optional<slang::DiagCode>)0x0);
    if (pCVar2 != (ClassType *)0x0) {
      (context->scope).ptr = (Scope *)pCVar2;
      goto LAB_0040358f;
    }
  }
LAB_00403607:
  uVar4 = 0;
LAB_00403609:
  pVar9._8_8_ = uVar4;
  pVar9.first = pCVar7;
  return pVar9;
}

Assistant:

static std::pair<const ClassType*, bool> resolveNewClassTarget(const NameSyntax& nameSyntax,
                                                               const ASTContext& context,
                                                               const Type*& assignmentTarget,
                                                               SourceRange range) {
    // If the new expression is typed, look up that type as the target.
    // Otherwise, the target must come from the expression context.
    bool isSuperClass = false;
    const ClassType* classType = nullptr;
    if (nameSyntax.kind == SyntaxKind::ConstructorName) {
        if (!assignmentTarget || !assignmentTarget->isClass()) {
            if (!assignmentTarget || !assignmentTarget->isError())
                context.addDiag(diag::NewClassTarget, range);
            return {nullptr, false};
        }

        classType = &assignmentTarget->getCanonicalType().as<ClassType>();
    }
    else {
        auto& scoped = nameSyntax.as<ScopedNameSyntax>();
        if (scoped.left->getLastToken().kind == TokenKind::SuperKeyword) {
            // This is a super.new invocation, so find the base class's
            // constructor. This is relative to our current context, not
            // any particular assignment target.
            auto [ct, _] = Lookup::getContainingClass(*context.scope);
            classType = ct;
            if (!classType || classType->name.empty()) {
                // Parser already emitted an error for this case.
                return {nullptr, false};
            }

            auto base = classType->getBaseClass();
            if (!base) {
                context.addDiag(diag::SuperNoBase, nameSyntax.sourceRange()) << classType->name;
                return {nullptr, false};
            }

            if (base->isError())
                return {nullptr, false};

            classType = &base->as<Type>().getCanonicalType().as<ClassType>();
            assignmentTarget = &context.getCompilation().getVoidType();
            isSuperClass = true;
        }
        else {
            auto& className = *nameSyntax.as<ScopedNameSyntax>().left;
            classType = Lookup::findClass(className, context);
            if (!classType)
                return {nullptr, false};

            assignmentTarget = classType;
        }
    }

    if (!isSuperClass && classType->isAbstract) {
        context.addDiag(diag::NewVirtualClass, range) << classType->name;
        return {nullptr, false};
    }

    if (!isSuperClass && classType->isInterface) {
        context.addDiag(diag::NewInterfaceClass, range) << classType->name;
        return {nullptr, false};
    }

    return {classType, isSuperClass};
}